

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::CreateQtAutoGeneratorsTargets(cmGlobalGenerator *this,AutogensType *autogens)

{
  pointer ppcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  cmTarget *this_00;
  uint uVar4;
  ulong uVar5;
  string *name;
  byte bVar6;
  __node_base *p_Var7;
  allocator local_b23;
  allocator local_b22;
  allocator local_b21;
  cmGlobalGenerator *local_b20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targetNames;
  pair<cmQtAutoGenerators,_cmTarget_*> local_af0;
  cmQtAutoGenerators autogen;
  pair<cmQtAutoGenerators,_const_cmTarget_*> local_3c8;
  
  uVar4 = 0;
  local_b20 = this;
  while( true ) {
    uVar5 = (ulong)uVar4;
    ppcVar1 = (local_b20->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_b20->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <= uVar5)
    break;
    pcVar2 = ppcVar1[uVar5]->Makefile;
    targetNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targetNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targetNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&targetNames,(pcVar2->Targets)._M_h._M_element_count);
    p_Var7 = &(pcVar2->Targets)._M_h._M_before_begin;
    while (p_Var7 = p_Var7->_M_nxt,
          name = targetNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, p_Var7 != (__node_base *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&targetNames,(value_type *)(p_Var7 + 0x3a));
    }
    for (; name != targetNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; name = name + 1) {
      this_00 = cmMakefile::FindTarget
                          ((local_b20->LocalGenerators).
                           super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar5]->Makefile,name,true);
      if (this_00->TargetTypeValue < UTILITY) {
        std::__cxx11::string::string((string *)&local_3c8,"AUTOMOC",&local_b21);
        bVar3 = cmTarget::GetPropertyAsBool(this_00,(string *)&local_3c8);
        if (bVar3) {
          bVar6 = this_00->IsImportedTarget ^ 1;
        }
        else {
          std::__cxx11::string::string((string *)&local_af0,"AUTOUIC",&local_b22);
          bVar3 = cmTarget::GetPropertyAsBool(this_00,(string *)&local_af0);
          if (bVar3) {
            bVar6 = this_00->IsImportedTarget ^ 1;
          }
          else {
            std::__cxx11::string::string((string *)&autogen,"AUTORCC",&local_b23);
            bVar3 = cmTarget::GetPropertyAsBool(this_00,&autogen.QtMajorVersion);
            if (bVar3) {
              bVar6 = this_00->IsImportedTarget ^ 1;
            }
            else {
              bVar6 = 0;
            }
            std::__cxx11::string::~string((string *)&autogen);
          }
          std::__cxx11::string::~string((string *)&local_af0);
        }
        std::__cxx11::string::~string((string *)&local_3c8);
        if (bVar6 != 0) {
          cmQtAutoGenerators::cmQtAutoGenerators(&autogen);
          bVar3 = cmQtAutoGenerators::InitializeAutogenTarget(&autogen,this_00);
          if (bVar3) {
            cmQtAutoGenerators::cmQtAutoGenerators(&local_af0.first,&autogen);
            local_af0.second = this_00;
            std::pair<cmQtAutoGenerators,_const_cmTarget_*>::
            pair<cmQtAutoGenerators,_cmTarget_*,_true>(&local_3c8,&local_af0);
            std::
            vector<std::pair<cmQtAutoGenerators,cmTarget_const*>,std::allocator<std::pair<cmQtAutoGenerators,cmTarget_const*>>>
            ::emplace_back<std::pair<cmQtAutoGenerators,cmTarget_const*>>
                      ((vector<std::pair<cmQtAutoGenerators,cmTarget_const*>,std::allocator<std::pair<cmQtAutoGenerators,cmTarget_const*>>>
                        *)autogens,&local_3c8);
            cmQtAutoGenerators::~cmQtAutoGenerators(&local_3c8.first);
            cmQtAutoGenerators::~cmQtAutoGenerators(&local_af0.first);
          }
          cmQtAutoGenerators::~cmQtAutoGenerators(&autogen);
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&targetNames);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateQtAutoGeneratorsTargets(AutogensType &autogens)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  for(unsigned int i=0; i < this->LocalGenerators.size(); ++i)
    {
    cmTargets& targets =
      this->LocalGenerators[i]->GetMakefile()->GetTargets();
    std::vector<std::string> targetNames;
    targetNames.reserve(targets.size());
    for(cmTargets::iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      targetNames.push_back(ti->second.GetName());
      }
    for(std::vector<std::string>::iterator ti = targetNames.begin();
        ti != targetNames.end(); ++ti)
      {
      cmTarget& target = *this->LocalGenerators[i]
                              ->GetMakefile()->FindTarget(*ti, true);
      if(target.GetType() == cmTarget::EXECUTABLE ||
         target.GetType() == cmTarget::STATIC_LIBRARY ||
         target.GetType() == cmTarget::SHARED_LIBRARY ||
         target.GetType() == cmTarget::MODULE_LIBRARY ||
         target.GetType() == cmTarget::OBJECT_LIBRARY)
        {
        if((target.GetPropertyAsBool("AUTOMOC")
              || target.GetPropertyAsBool("AUTOUIC")
              || target.GetPropertyAsBool("AUTORCC"))
            && !target.IsImported())
          {
          cmQtAutoGenerators autogen;
          if(autogen.InitializeAutogenTarget(&target))
            {
            autogens.push_back(std::make_pair(autogen, &target));
            }
          }
        }
      }
    }
#else
  (void)autogens;
#endif
}